

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O0

bool __thiscall
OpenMD::FragmentStamp::isAtomInRigidBody
          (FragmentStamp *this,int atomIndex,int *whichRigidBody,int *consAtomIndex)

{
  int iVar1;
  reference pvVar2;
  size_t sVar3;
  int *in_RCX;
  value_type *in_RDX;
  int in_ESI;
  FragmentStamp *in_RDI;
  int j;
  int numAtom;
  RigidBodyStamp *rbStamp;
  int in_stack_ffffffffffffffbc;
  int local_38;
  
  *in_RDX = -1;
  *in_RCX = -1;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->atom2Rigidbody,(long)in_ESI);
  if (-1 < *pvVar2) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&in_RDI->atom2Rigidbody,(long)in_ESI);
    *in_RDX = *pvVar2;
    getRigidBodyStamp(in_RDI,in_stack_ffffffffffffffbc);
    sVar3 = RigidBodyStamp::getNMembers((RigidBodyStamp *)0x2acb90);
    for (local_38 = 0; local_38 < (int)sVar3; local_38 = local_38 + 1) {
      iVar1 = RigidBodyStamp::getMemberAt((RigidBodyStamp *)in_RDI,in_stack_ffffffffffffffbc);
      if (iVar1 == in_ESI) {
        *in_RCX = local_38;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool FragmentStamp::isAtomInRigidBody(int atomIndex, int& whichRigidBody,
                                        int& consAtomIndex) {
    whichRigidBody = -1;
    consAtomIndex  = -1;

    if (atom2Rigidbody[atomIndex] >= 0) {
      whichRigidBody          = atom2Rigidbody[atomIndex];
      RigidBodyStamp* rbStamp = getRigidBodyStamp(whichRigidBody);
      int numAtom             = rbStamp->getNMembers();
      for (int j = 0; j < numAtom; j++) {
        if (rbStamp->getMemberAt(j) == atomIndex) {
          consAtomIndex = j;
          return true;
        }
      }
    }

    return false;
  }